

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O0

int __thiscall Fl_Slider::scrollvalue(Fl_Slider *this,int pos,int size,int first,int total)

{
  int iVar1;
  undefined8 local_30;
  undefined4 local_20;
  int total_local;
  int first_local;
  int size_local;
  int pos_local;
  Fl_Slider *this_local;
  
  Fl_Valuator::step(&this->super_Fl_Valuator,1.0,1);
  local_20 = total;
  if (first + total < pos + size) {
    local_20 = (pos + size) - first;
  }
  if (size < local_20) {
    local_30 = (double)size / (double)local_20;
  }
  else {
    local_30 = 1.0;
  }
  slider_size(this,local_30);
  bounds(this,(double)first,(double)((local_20 - size) + first));
  iVar1 = Fl_Valuator::value(&this->super_Fl_Valuator,(double)pos);
  return iVar1;
}

Assistant:

int Fl_Slider::scrollvalue(int pos, int size, int first, int total) {
  step(1, 1);
  if (pos+size > first+total) total = pos+size-first;
  slider_size(size >= total ? 1.0 : double(size)/double(total));
  bounds(first, total-size+first);
  return value(pos);
}